

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ParseBlendFile
          (BlenderImporter *this,FileDatabase *out,shared_ptr<Assimp::IOStream> *stream)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pFVar1;
  pointer pFVar2;
  long lVar3;
  FileDatabase *pFVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  DNA *pDVar10;
  DNAParser dna_reader;
  SectionParser parser;
  DNAParser local_a8;
  shared_ptr<Assimp::IOStream> local_a0;
  FileDatabase *local_90;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  size_t local_60;
  Pointer PStack_58;
  element_type *local_40;
  bool local_38;
  
  local_88._0_8_ = operator_new(0x38);
  local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  StreamReader<true,_true>::StreamReader
            ((StreamReader<true,_true> *)local_88._0_8_,&local_a0,out->little);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::StreamReader<true,true>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
             (StreamReader<true,_true> *)local_88._0_8_);
  uVar6 = local_88._8_8_;
  uVar5 = local_88._0_8_;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (out->reader).
            super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (out->reader).super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar5;
  (out->reader).super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  if (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_a8.db = out;
  std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
  reserve(&(out->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
          ,0x80);
  local_40 = (out->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_38 = out->i64bit;
  local_88._8_8_ = &local_70;
  local_88._16_8_ = 0;
  local_70._M_local_buf[0] = '\0';
  local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
  local_60 = 0;
  PStack_58.val = 0;
  pDVar10 = (DNA *)0x0;
  local_90 = out;
  do {
    Blender::SectionParser::Next((SectionParser *)local_88);
    iVar7 = std::__cxx11::string::compare(local_88 + 8);
    if (iVar7 != 0) {
      iVar8 = std::__cxx11::string::compare(local_88 + 8);
      if (iVar8 == 0) {
        Blender::DNAParser::Parse(&local_a8);
        pDVar10 = &(local_a8.db)->dna;
      }
      else {
        std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
        ::push_back(&(out->entries).
                     super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                    ,(value_type *)local_88);
      }
    }
  } while (iVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._8_8_ != &local_70) {
    operator_delete((void *)local_88._8_8_,
                    CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1);
  }
  pFVar4 = local_90;
  if (pDVar10 == (DNA *)0x0) {
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"SDNA not found","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_88);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  pFVar1 = (pFVar4->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (pFVar4->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar1 != pFVar2) {
    uVar9 = ((long)pFVar2 - (long)pFVar1 >> 3) * -0x71c71c71c71c71c7;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::Blender::FileBlockHead*,std::vector<Assimp::Blender::FileBlockHead,std::allocator<Assimp::Blender::FileBlockHead>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pFVar1,pFVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::Blender::FileBlockHead*,std::vector<Assimp::Blender::FileBlockHead,std::allocator<Assimp::Blender::FileBlockHead>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pFVar1,pFVar2);
  }
  return;
}

Assistant:

void BlenderImporter::ParseBlendFile(FileDatabase& out, std::shared_ptr<IOStream> stream)
{
    out.reader = std::shared_ptr<StreamReaderAny>(new StreamReaderAny(stream,out.little));

    DNAParser dna_reader(out);
    const DNA* dna = NULL;

    out.entries.reserve(128); { // even small BLEND files tend to consist of many file blocks
        SectionParser parser(*out.reader.get(),out.i64bit);

        // first parse the file in search for the DNA and insert all other sections into the database
        while ((parser.Next(),1)) {
            const FileBlockHead& head = parser.GetCurrent();

            if (head.id == "ENDB") {
                break; // only valid end of the file
            }
            else if (head.id == "DNA1") {
                dna_reader.Parse();
                dna = &dna_reader.GetDNA();
                continue;
            }

            out.entries.push_back(head);
        }
    }
    if (!dna) {
        ThrowException("SDNA not found");
    }

    std::sort(out.entries.begin(),out.entries.end());
}